

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc-test.c++
# Opt level: O0

DispatchCallResult __thiscall
capnp::_::anon_unknown_0::TestNoTailForwarder::dispatchCall
          (TestNoTailForwarder *this,uint64_t interfaceId,uint16_t methodId,
          CallContext<capnp::AnyPointer,_capnp::AnyPointer> context)

{
  RequestHook **__return_storage_ptr__;
  long lVar1;
  Reader value;
  uint64_t uVar2;
  Promise<void> *pPVar3;
  size_t __n;
  undefined6 in_register_00000012;
  void *__buf;
  undefined8 extraout_RDX;
  int __flags;
  Maybe<capnp::MessageSize> *this_00;
  DispatchCallResult DVar5;
  MessageSize MVar6;
  RemotePromise<capnp::AnyPointer> local_120;
  Promise<void> local_f0;
  PromiseForResult<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_rpc_test_c__:2122:36),_capnp::Response<capnp::AnyPointer>_>
  promise;
  MessageSize local_a8;
  Maybe<capnp::MessageSize> local_98;
  undefined1 local_80 [8];
  Request<capnp::AnyPointer,_capnp::AnyPointer> req;
  Reader params;
  uint16_t methodId_local;
  uint64_t interfaceId_local;
  TestNoTailForwarder *this_local;
  CallContext<capnp::AnyPointer,_capnp::AnyPointer> context_local;
  undefined8 uVar4;
  
  context_local.hook = (CallContextHook *)this;
  uVar2 = typeId<capnproto_test::capnp::test::TestMoreStuff,capnproto_test::capnp::test::TestMoreStuff::_capnpPrivate>
                    ();
  if ((CONCAT62(in_register_00000012,methodId) == uVar2) && ((uint16_t)context.hook == 3)) {
    DVar5 = capnproto_test::capnp::test::TestMoreStuff::Server::dispatchCall
                      ((Server *)this,interfaceId,methodId,
                       (CallContextHook *)((ulong)context.hook & 0xffff));
    uVar4 = DVar5._8_8_;
  }
  else {
    __return_storage_ptr__ = &req.hook.ptr;
    CallContext<capnp::AnyPointer,_capnp::AnyPointer>::getParams
              ((Reader *)__return_storage_ptr__,
               (CallContext<capnp::AnyPointer,_capnp::AnyPointer> *)&this_local);
    lVar1 = *(long *)(*(long *)(interfaceId + 8) + -0x18);
    MVar6 = AnyPointer::Reader::targetSize((Reader *)__return_storage_ptr__);
    local_a8.wordCount = MVar6.wordCount;
    local_a8.capCount = MVar6.capCount;
    this_00 = &local_98;
    kj::Maybe<capnp::MessageSize>::Maybe(this_00,&local_a8);
    __n = (ulong)context.hook & 0xffff;
    Capability::Client::typelessRequest
              ((Request<capnp::AnyPointer,_capnp::AnyPointer> *)local_80,
               (Client *)(interfaceId + 8 + lVar1),CONCAT62(in_register_00000012,methodId),
               (uint16_t)context.hook,this_00,(CallHints)0x0);
    __flags = (int)this_00;
    kj::Maybe<capnp::MessageSize>::~Maybe(&local_98);
    promise.super_PromiseBase.node.ptr = (PromiseBase)(PromiseBase)req.hook.ptr;
    value.reader.capTable = (CapTableReader *)params.reader.segment;
    value.reader.segment = (SegmentReader *)req.hook.ptr;
    value.reader.pointer = (WirePointer *)params.reader.capTable;
    value.reader._24_8_ = params.reader.pointer;
    AnyPointer::Builder::set((Builder *)local_80,value);
    Request<capnp::AnyPointer,_capnp::AnyPointer>::send
              ((Request<capnp::AnyPointer,_capnp::AnyPointer> *)&local_120,(int)local_80,__buf,__n,
               __flags);
    kj::Promise<capnp::Response<capnp::AnyPointer>>::
    then<capnp::_::(anonymous_namespace)::TestNoTailForwarder::dispatchCall(unsigned_long,unsigned_short,capnp::CallContext<capnp::AnyPointer,capnp::AnyPointer>)::_lambda(capnp::Response<capnp::AnyPointer>)_1_>
              ((Promise<capnp::Response<capnp::AnyPointer>> *)&local_f0,(Type *)&local_120);
    RemotePromise<capnp::AnyPointer>::~RemotePromise(&local_120);
    pPVar3 = kj::mv<kj::Promise<void>>(&local_f0);
    kj::Promise<void>::Promise((Promise<void> *)this,pPVar3);
    *(undefined1 *)&this->next = 0;
    (this->next).field_0x1 = 0;
    kj::Promise<void>::~Promise(&local_f0);
    Request<capnp::AnyPointer,_capnp::AnyPointer>::~Request
              ((Request<capnp::AnyPointer,_capnp::AnyPointer> *)local_80);
    uVar4 = extraout_RDX;
  }
  DVar5.isStreaming = (bool)(char)uVar4;
  DVar5.allowCancellation = (bool)(char)((ulong)uVar4 >> 8);
  DVar5._10_6_ = (int6)((ulong)uVar4 >> 0x10);
  DVar5.promise.super_PromiseBase.node.ptr = (PromiseBase)(PromiseBase)this;
  return DVar5;
}

Assistant:

DispatchCallResult dispatchCall(uint64_t interfaceId, uint16_t methodId,
                                  CallContext<AnyPointer, AnyPointer> context) override {
    if (interfaceId == capnp::typeId<test::TestMoreStuff>() && methodId == 3) {
      // Calling TestMoreStuff.hold(). Dispatch normally.
      return test::TestMoreStuff::Server::dispatchCall(interfaceId, methodId, context);
    }

    auto params = context.getParams();
    auto req = next.typelessRequest(interfaceId, methodId, params.targetSize(), {});
    req.set(params);
    auto promise = req.send().then([context](Response<AnyPointer> resp) mutable {
      context.getResults(resp.targetSize()).set(resp);
    });
    return { .promise = kj::mv(promise), .isStreaming = false };
  }